

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assetsys.h
# Opt level: O3

int assetsys_file_count(assetsys_t *sys,char *path)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = 0;
  if (path != (char *)0x0) {
    iVar1 = assetsys_internal_find_collated(sys,path);
    iVar2 = 0;
    if (0 < (long)sys->collated_count) {
      lVar3 = 0;
      iVar2 = 0;
      do {
        if (*(int *)((long)&sys->collated->is_file + lVar3) != 0) {
          iVar2 = iVar2 + (uint)(*(int *)((long)&sys->collated->parent + lVar3) == iVar1);
        }
        lVar3 = lVar3 + 0x18;
      } while ((long)sys->collated_count * 0x18 != lVar3);
    }
  }
  return iVar2;
}

Assistant:

int assetsys_file_count( assetsys_t* sys, char const* path )
    {
    if( !path ) return 0;
    int dir = assetsys_internal_find_collated( sys, path );
    int count = 0;
    for( int i = 0; i < sys->collated_count; ++i )
        {
        if( sys->collated[ i ].is_file && sys->collated[ i ].parent == dir )
            {
            ++count;
            }
        }
    return count;
    }